

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O2

void __thiscall helics::Publication::publish(Publication *this,double *vals,int size)

{
  ValueFederate *pVVar1;
  bool bVar2;
  size_t size_00;
  SmallBuffer db;
  allocator_type local_b1;
  data_view local_b0;
  SmallBuffer local_90;
  
  pVVar1 = this->fed;
  size_00 = (size_t)size;
  if (this->changeDetectionEnabled == true) {
    bVar2 = changeDetected(&this->prevValue,vals,size_00,this->delta);
    if (!bVar2) {
      return;
    }
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)&local_90,vals,vals + size_00,&local_b1);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&this->prevValue,(vector<double,_std::allocator<double>_> *)&local_90);
    CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_90);
  }
  if (pVVar1 != (ValueFederate *)0x0) {
    typeConvert(&local_90,this->pubType,vals,size_00);
    local_b0.dblock._M_len = local_90.bufferSize;
    local_b0.dblock._M_str = (char *)local_90.heap;
    local_b0.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_b0.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    helics::ValueFederate::publishBytes(this->fed,this,&local_b0);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_b0.ref.
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    SmallBuffer::~SmallBuffer(&local_90);
  }
  return;
}

Assistant:

void Publication::publish(const double* vals, int size)
{
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, vals, size, delta)) {
            prevValue = std::vector<double>(vals, vals + size);
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvert(pubType, vals, size);
        fed->publishBytes(*this, db);
    }
}